

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::BufferTestUtil::IndexArrayVerifier::verify
          (IndexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *this_00;
  byte bVar1;
  RenderContext *pRVar2;
  uint count;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var_00;
  long lVar5;
  undefined7 extraout_var;
  long lVar6;
  long lVar7;
  pointer pVVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  allocator<char> local_1d9;
  uchar *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  RGBA threshold;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> colors;
  int local_190;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Random rnd;
  Surface referenceImg;
  Surface indexBufferImg;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fetchedColor;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> fetchedPos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string imageSetDesc;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1d8 = tbs;
  iVar4 = (*((this->super_BufferVerifierBase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  uVar12 = *(uint *)CONCAT44(extraout_var_00,iVar4);
  uVar9 = (ulong)uVar12;
  if (0x7f < (int)uVar12) {
    uVar9 = 0x80;
  }
  uVar12 = ((uint *)CONCAT44(extraout_var_00,iVar4))[1];
  uVar10 = 0x80;
  if ((int)uVar12 < 0x80) {
    uVar10 = uVar12;
  }
  threshold.m_value = 0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&fetchedPos,0x81,(allocator_type *)&rnd);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fetchedColor,0x81,(allocator_type *)&rnd);
  iVar4 = (int)uVar9;
  tcu::Surface::Surface(&indexBufferImg,iVar4,uVar10);
  tcu::Surface::Surface(&referenceImg,iVar4,uVar10);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&positions,0x100);
  lVar5 = 4;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    fVar13 = (float)(int)lVar6 / 15.0;
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      fVar14 = (float)(int)lVar7 / 15.0;
      *(float *)((long)positions.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar7].m_data + lVar5 + -4) =
           fVar14 + fVar14 + -1.0;
      *(float *)((long)positions.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar7].m_data + lVar5) =
           fVar13 + fVar13 + -1.0;
    }
    lVar5 = lVar5 + 0x80;
  }
  deRandom_init(&rnd.m_rnd,0xabc231);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::resize(&colors,0x100)
  ;
  for (pVVar8 = colors.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar8 != colors.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; pVVar8 = pVVar8 + 1) {
    fVar13 = deRandom_getFloat(&rnd.m_rnd);
    pVVar8->m_data[0] = fVar13 * 0.4 + 0.1;
    fVar13 = deRandom_getFloat(&rnd.m_rnd);
    pVVar8->m_data[1] = fVar13 * 0.4 + 0.1;
    fVar13 = deRandom_getFloat(&rnd.m_rnd);
    pVVar8->m_data[2] = fVar13 * 0.4 + 0.1;
  }
  this_00 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,(GLuint)ctx);
  glu::CallLogWrapper::glViewport(this_00,0,0,iVar4,uVar10);
  glu::CallLogWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(this_00,(this->m_program->m_program).m_program);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_posLoc);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,this->m_colorLoc);
  glu::CallLogWrapper::glEnable(this_00,0xbe2);
  glu::CallLogWrapper::glBlendFunc(this_00,1,1);
  glu::CallLogWrapper::glBlendEquation(this_00,0x8006);
  local_1cc = (int)local_1d8 + -2;
  local_190 = (int)siglen;
  iVar4 = 0;
  do {
    uVar12 = (int)local_1d8 - iVar4;
    iVar11 = iVar4;
    if (uVar12 == 0 || (int)local_1d8 < iVar4) break;
    uVar10 = 0x81;
    if (uVar12 < 0x81) {
      uVar10 = uVar12;
    }
    count = uVar10;
    if ((int)uVar12 < 2) {
      iVar11 = local_1cc;
      uVar10 = uVar12;
      count = 2;
    }
    local_1c8 = iVar4;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Bytes ",&local_1d9);
    iVar4 = iVar11 + local_190;
    local_1c0 = iVar4;
    de::toString<int>(&local_90,&local_1c0);
    std::operator+(&local_50,&local_d0,&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                   &local_50," to ");
    local_1c4 = iVar4 + count + -1;
    de::toString<int>(&local_70,&local_1c4);
    std::operator+(&imageSetDesc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                   &local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&rnd);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_posLoc,2,0x1406,'\0',0,
               positions.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_colorLoc,3,0x1406,'\0',0,
               colors.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glDrawElements(this_00,3,count,0x1401,(void *)(long)iVar4);
    pRVar2 = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&rnd,&indexBufferImg);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)&rnd);
    for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
      *(undefined8 *)
       fetchedPos.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar9].m_data =
           *(undefined8 *)
            positions.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[sig[uVar9 + (long)iVar11 + (long)local_190]].
            m_data;
    }
    pVVar8 = fetchedColor.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
      bVar1 = sig[uVar9 + (long)iVar11 + (long)local_190];
      pVVar8->m_data[2] =
           colors.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start[bVar1].m_data[2];
      *(undefined8 *)pVVar8->m_data =
           *(undefined8 *)
            colors.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[bVar1].m_data;
      pVVar8 = pVVar8 + 1;
    }
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_posLoc,2,0x1406,'\0',0,
               fetchedPos.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,this->m_colorLoc,3,0x1406,'\0',0,
               fetchedColor.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glDrawArrays(this_00,3,0,count);
    pRVar2 = ((this->super_BufferVerifierBase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)&rnd,&referenceImg);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)&rnd);
    bVar3 = tcu::pixelThresholdCompare
                      (((this->super_BufferVerifierBase).m_context)->m_testCtx->m_log,"RenderResult"
                       ,imageSetDesc._M_dataplus._M_p,&referenceImg,&indexBufferImg,&threshold,
                       COMPARE_LOG_RESULT);
    iVar11 = local_1c8;
    uVar9 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
    iVar4 = uVar10 + local_1c8;
    std::__cxx11::string::~string((string *)&imageSetDesc);
  } while ((char)uVar9 != '\0');
  bVar3 = (int)local_1d8 <= iVar11;
  tcu::Surface::~Surface(&referenceImg);
  tcu::Surface::~Surface(&indexBufferImg);
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&fetchedColor.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return (int)CONCAT71((int7)(uVar9 >> 8),bVar3);
}

Assistant:

bool IndexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					viewportW			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_WIDTH, renderTarget.getWidth());
	const int					viewportH			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_HEIGHT, renderTarget.getHeight());
	const int					minBytesPerBatch	= 2;
	const tcu::RGBA				threshold			(0,0,0,0);

	std::vector<tcu::Vec2>		positions;
	std::vector<tcu::Vec3>		colors;

	std::vector<tcu::Vec2>		fetchedPos			(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);
	std::vector<tcu::Vec3>		fetchedColor		(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);

	tcu::Surface				indexBufferImg		(viewportW, viewportH);
	tcu::Surface				referenceImg		(viewportW, viewportH);

	int							numVerified			= 0;
	bool						isOk				= true;

	DE_STATIC_ASSERT(sizeof(tcu::Vec2) == sizeof(float)*2);
	DE_STATIC_ASSERT(sizeof(tcu::Vec3) == sizeof(float)*3);

	computeIndexVerifierPositions(positions);
	computeIndexVerifierColors(colors);

	// Reset buffer bindings.
	glBindBuffer				(GL_ARRAY_BUFFER,			0);
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	buffer);

	// Setup rendering state.
	glViewport					(0, 0, viewportW, viewportH);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(m_posLoc);
	glEnableVertexAttribArray	(m_colorLoc);
	glEnable					(GL_BLEND);
	glBlendFunc					(GL_ONE, GL_ONE);
	glBlendEquation				(GL_FUNC_ADD);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < minBytesPerBatch;
		int		numBytesToVerify	= isLeftoverBatch ? minBytesPerBatch			: de::min(MAX_LINES_PER_INDEX_ARRAY_DRAW+1, numRemaining);
		int		curOffset			= isLeftoverBatch ? (numBytes-minBytesPerBatch)	: numVerified;
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		// Step 1: Render using index buffer.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &positions[0]);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, &colors[0]);
		glDrawElements			(GL_LINE_STRIP, numBytesToVerify, GL_UNSIGNED_BYTE, (void*)(deUintptr)(offset+curOffset));
		glu::readPixels			(m_context.getRenderContext(), 0, 0, indexBufferImg.getAccess());

		// Step 2: Do manual fetch and render without index buffer.
		execVertexFetch(&fetchedPos[0], &positions[0], refPtr+offset+curOffset, numBytesToVerify);
		execVertexFetch(&fetchedColor[0], &colors[0], refPtr+offset+curOffset, numBytesToVerify);

		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &fetchedPos[0]);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, &fetchedColor[0]);
		glDrawArrays			(GL_LINE_STRIP, 0, numBytesToVerify);
		glu::readPixels			(m_context.getRenderContext(), 0, 0, referenceImg.getAccess());

		if (!tcu::pixelThresholdCompare(m_context.getTestContext().getLog(), "RenderResult", imageSetDesc.c_str(), referenceImg, indexBufferImg, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	return isOk;
}